

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

Block * __thiscall wasm::Builder::blockify(Builder *this,Expression *any,Expression *append)

{
  if ((any == (Expression *)0x0) || (any->_id != BlockId)) {
    any = (Expression *)makeBlock(this,any);
  }
  if (append != (Expression *)0x0) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(((Block *)any)->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,append);
    wasm::Block::finalize(any);
  }
  return (Block *)any;
}

Assistant:

Block* blockify(Expression* any, Expression* append = nullptr) {
    Block* block = nullptr;
    if (any) {
      block = any->dynCast<Block>();
    }
    if (!block) {
      block = makeBlock(any);
    }
    if (append) {
      block->list.push_back(append);
      block->finalize();
    }
    return block;
  }